

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O2

void Saig_Bmc3ManStop(Gia_ManBmc_t *p)

{
  Vec_Wec_t *__ptr;
  void *__ptr_00;
  Hsh_IntMan_t *__ptr_01;
  Vec_Wrd_t *__ptr_02;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int i;
  long lVar2;
  uint uVar3;
  int level;
  bmcg_sat_solver *s;
  satoko_t *s_00;
  Vec_Int_t *__ptr_03;
  char **__ptr_04;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  int nVars;
  ulong uVar8;
  uint uVar9;
  undefined8 local_40;
  sat_solver *psVar4;
  
  if (p->pPars->fVerbose != 0) {
    psVar4 = p->pSat;
    if (psVar4 == (sat_solver *)0x0) {
      uVar8 = 0;
LAB_00475198:
      if (p->pSat3 == (bmcg_sat_solver *)0x0) {
        iVar1 = satoko_varnum(p->pSat2);
        local_40 = CONCAT44(extraout_var_01,iVar1);
      }
      else {
        iVar1 = bmcg_sat_solver_varnum(p->pSat3);
        local_40 = CONCAT44(extraout_var_00,iVar1);
      }
      uVar3 = 0;
      uVar9 = 0;
      uVar5 = 0;
      uVar7 = 0;
    }
    else {
      uVar8 = 0;
      for (lVar2 = 0; lVar2 < psVar4->size; lVar2 = lVar2 + 1) {
        if (psVar4->pFreqs[lVar2] != '\0') {
          psVar4->pFreqs[lVar2] = '\0';
          uVar8 = (ulong)((int)uVar8 + 1);
        }
      }
      psVar4 = p->pSat;
      if (psVar4 == (sat_solver *)0x0) goto LAB_00475198;
      uVar5 = (ulong)(uint)psVar4->nLearntStart;
      uVar9 = psVar4->nLearntDelta;
      uVar7 = psVar4->nLearntRatio;
      uVar3 = psVar4->nDBreduces;
      iVar1 = sat_solver_nvars(psVar4);
      local_40 = CONCAT44(extraout_var,iVar1);
    }
    psVar4 = p->pSat;
    if (psVar4 == (sat_solver *)0x0) {
      s = p->pSat3;
      if (s == (bmcg_sat_solver *)0x0) {
        s_00 = p->pSat2;
        iVar1 = satoko_varnum(s_00);
        level = (int)s_00;
      }
      else {
        iVar1 = bmcg_sat_solver_varnum(s);
        level = (int)s;
      }
    }
    else {
      iVar1 = sat_solver_nvars(psVar4);
      level = (int)psVar4;
    }
    Abc_Print(level,
              "LStart(P) = %d  LDelta(Q) = %d  LRatio(R) = %d  ReduceDB = %d  Vars = %d  Used = %d (%.2f %%)\n"
              ,((double)(int)uVar8 * 100.0) / (double)iVar1,uVar5,(ulong)uVar9,(ulong)uVar7,
              (ulong)uVar3,local_40,uVar8);
    Abc_Print(p->nUniProps,
              "Buffs = %d. Dups = %d.   Hash hits = %d.  Hash misses = %d.  UniProps = %d.\n",
              (ulong)(uint)p->nBufNum,(ulong)(uint)p->nDupNum,(ulong)(uint)p->nHashHit,
              (ulong)(uint)p->nHashMiss,(ulong)(uint)p->nUniProps);
  }
  if (p->vCexes != (Vec_Ptr_t *)0x0) {
    if (p->pAig->vSeqModelVec != (Vec_Ptr_t *)0x0) {
      __assert_fail("p->pAig->vSeqModelVec == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc3.c"
                    ,0x332,"void Saig_Bmc3ManStop(Gia_ManBmc_t *)");
    }
    p->pAig->vSeqModelVec = p->vCexes;
    p->vCexes = (Vec_Ptr_t *)0x0;
  }
  __ptr = p->vVisited;
  __ptr_03 = __ptr->pArray;
  lVar2 = 8;
  for (lVar6 = 0; lVar6 < __ptr->nCap; lVar6 = lVar6 + 1) {
    __ptr_00 = *(void **)((long)&__ptr_03->nCap + lVar2);
    if (__ptr_00 != (void *)0x0) {
      free(__ptr_00);
      __ptr_03 = __ptr->pArray;
      *(undefined8 *)((long)&__ptr_03->nCap + lVar2) = 0;
    }
    lVar2 = lVar2 + 0x10;
  }
  free(__ptr_03);
  free(__ptr);
  Vec_IntFree(p->vMapping);
  Vec_IntFree(p->vMapRefs);
  Vec_IntFree(p->vId2Num);
  Vec_VecFree((Vec_Vec_t *)p->vId2Var);
  Vec_PtrFreeFree(p->vTerInfo);
  if (p->pSat != (sat_solver *)0x0) {
    sat_solver_delete(p->pSat);
  }
  if (p->pSat2 != (solver_t *)0x0) {
    satoko_destroy(p->pSat2);
  }
  if (p->pSat3 != (bmcg_sat_solver *)0x0) {
    bmcg_sat_solver_stop(p->pSat3);
  }
  if (p->pTime4Outs != (abctime *)0x0) {
    free(p->pTime4Outs);
    p->pTime4Outs = (abctime *)0x0;
  }
  Vec_IntFree(p->vData);
  __ptr_01 = p->vHash;
  Vec_IntFree(__ptr_01->vTable);
  __ptr_02 = __ptr_01->vObjs;
  free(__ptr_02->pArray);
  free(__ptr_02);
  free(__ptr_01);
  Vec_IntFree(p->vId2Lit);
  if (p->pSopSizes != (char *)0x0) {
    free(p->pSopSizes);
    p->pSopSizes = (char *)0x0;
  }
  __ptr_04 = p->pSops;
  if (__ptr_04[1] != (char *)0x0) {
    free(__ptr_04[1]);
    p->pSops[1] = (char *)0x0;
    __ptr_04 = p->pSops;
    if (__ptr_04 == (char **)0x0) goto LAB_004753cd;
  }
  free(__ptr_04);
LAB_004753cd:
  free(p);
  return;
}

Assistant:

void Saig_Bmc3ManStop( Gia_ManBmc_t * p )
{
    if ( p->pPars->fVerbose )
    {
        int nUsedVars = p->pSat ? sat_solver_count_usedvars(p->pSat) : 0;
        Abc_Print( 1, "LStart(P) = %d  LDelta(Q) = %d  LRatio(R) = %d  ReduceDB = %d  Vars = %d  Used = %d (%.2f %%)\n", 
            p->pSat ? p->pSat->nLearntStart     : 0, 
            p->pSat ? p->pSat->nLearntDelta     : 0, 
            p->pSat ? p->pSat->nLearntRatio     : 0, 
            p->pSat ? p->pSat->nDBreduces       : 0, 
            p->pSat ? sat_solver_nvars(p->pSat) : p->pSat3 ? bmcg_sat_solver_varnum(p->pSat3) : satoko_varnum(p->pSat2), 
            nUsedVars, 
            100.0*nUsedVars/(p->pSat ? sat_solver_nvars(p->pSat) : p->pSat3 ? bmcg_sat_solver_varnum(p->pSat3) : satoko_varnum(p->pSat2)) );
        Abc_Print( 1, "Buffs = %d. Dups = %d.   Hash hits = %d.  Hash misses = %d.  UniProps = %d.\n", 
            p->nBufNum, p->nDupNum, p->nHashHit, p->nHashMiss, p->nUniProps );
    }
//    Aig_ManCleanMarkA( p->pAig );
    if ( p->vCexes )
    {
        assert( p->pAig->vSeqModelVec == NULL );
        p->pAig->vSeqModelVec = p->vCexes;
        p->vCexes = NULL;
    }
//    Vec_PtrFreeFree( p->vCexes );
    Vec_WecFree( p->vVisited );
    Vec_IntFree( p->vMapping );
    Vec_IntFree( p->vMapRefs );
//    Vec_VecFree( p->vSects );
    Vec_IntFree( p->vId2Num );
    Vec_VecFree( (Vec_Vec_t *)p->vId2Var );
    Vec_PtrFreeFree( p->vTerInfo );
    if ( p->pSat )  sat_solver_delete( p->pSat );
    if ( p->pSat2 ) satoko_destroy( p->pSat2 );
    if ( p->pSat3 ) bmcg_sat_solver_stop( p->pSat3 );
    ABC_FREE( p->pTime4Outs );
    Vec_IntFree( p->vData );
    Hsh_IntManStop( p->vHash );
    Vec_IntFree( p->vId2Lit );
    ABC_FREE( p->pSopSizes );
    ABC_FREE( p->pSops[1] );
    ABC_FREE( p->pSops );
    ABC_FREE( p );
}